

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void outputMode(Problem *problem)

{
  bool bVar1;
  byte bVar2;
  Problem *this;
  UnitList **ppUVar3;
  ostream *poVar4;
  Problem *in_RDI;
  Unit *u;
  Iterator units;
  ScopedPtr<Kernel::Problem> prb;
  Problem *in_stack_00000240;
  Unit *in_stack_00000278;
  Options *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  ostream *in_stack_ffffffffffffff70;
  string local_70 [32];
  string local_50 [32];
  Unit *local_30;
  Iterator local_28 [3];
  ScopedPtr<Kernel::Problem> local_10 [2];
  
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(local_10,in_RDI);
  Shell::UIHelper::outputSymbolDeclarations(in_stack_ffffffffffffff70);
  this = Lib::ScopedPtr<Kernel::Problem>::operator->(local_10);
  ppUVar3 = Kernel::Problem::units(this);
  Lib::List<Kernel::Unit_*>::Iterator::Iterator(local_28,*ppUVar3);
  while (bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x184a9d), bVar1) {
    local_30 = Lib::List<Kernel::Unit_*>::Iterator::next
                         ((Iterator *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
    ;
    Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_00000278);
    poVar4 = std::operator<<((ostream *)&std::cout,local_50);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_50);
  }
  Shell::Options::latexOutput_abi_cxx11_(in_stack_ffffffffffffff58);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                          (char *)in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_70);
  if ((bVar2 & 1) != 0) {
    Lib::ScopedPtr<Kernel::Problem>::ptr(local_10);
    outputProblemToLaTeX(in_stack_00000240);
  }
  vampireReturnValue = 0;
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr
            ((ScopedPtr<Kernel::Problem> *)CONCAT17(bVar2,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void outputMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());

  while (units.hasNext()) {
    Unit* u = units.next();
    std::cout << TPTPPrinter::toString(u) << "\n";
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}